

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_iac(telnet_t *telnet,uchar cmd)

{
  uchar bytes [2];
  
  _send(telnet,(char *)bytes,2);
  return;
}

Assistant:

void telnet_iac(telnet_t *telnet, unsigned char cmd) {
	unsigned char bytes[2];
	bytes[0] = TELNET_IAC;
	bytes[1] = cmd;
	_sendu(telnet, bytes, 2);
}